

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_login_details(char *login,size_t len,char **userp,char **passwdp,char **optionsp)

{
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  size_t olen;
  size_t plen;
  size_t ulen;
  char *osep;
  char *psep;
  char *obuf;
  char *pbuf;
  char *ubuf;
  CURLcode result;
  char **optionsp_local;
  char **passwdp_local;
  char **userp_local;
  size_t len_local;
  char *login_local;
  
  ubuf._4_4_ = CURLE_OK;
  pbuf = (char *)0x0;
  obuf = (char *)0x0;
  psep = (char *)0x0;
  osep = (char *)0x0;
  ulen = 0;
  if ((passwdp != (char **)0x0) && (osep = strchr(login,0x3a), login + len <= osep)) {
    osep = (char *)0x0;
  }
  if ((optionsp != (char **)0x0) && (ulen = (size_t)strchr(login,0x3b), login + len <= ulen)) {
    ulen = 0;
  }
  if (osep == (char *)0x0) {
    local_90 = len;
    if (ulen != 0) {
      local_90 = ulen - (long)login;
    }
    local_88 = local_90;
  }
  else {
    if ((ulen == 0) || (osep <= ulen)) {
      local_80 = (long)osep - (long)login;
    }
    else {
      local_80 = ulen - (long)login;
    }
    local_88 = local_80;
  }
  if (osep == (char *)0x0) {
    local_a0 = (char *)0x0;
  }
  else {
    if ((ulen == 0) || (ulen <= osep)) {
      local_98 = login + (len - (long)osep);
    }
    else {
      local_98 = (char *)(ulen - (long)osep);
    }
    local_a0 = local_98 + -1;
  }
  if (ulen == 0) {
    local_b0 = (char *)0x0;
  }
  else {
    if ((osep == (char *)0x0) || (osep <= ulen)) {
      local_a8 = login + (len - ulen);
    }
    else {
      local_a8 = osep + -ulen;
    }
    local_b0 = local_a8 + -1;
  }
  if (((userp != (char **)0x0) && (local_88 != 0)) &&
     (pbuf = (char *)(*Curl_cmalloc)(local_88 + 1), pbuf == (char *)0x0)) {
    ubuf._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  if (((ubuf._4_4_ == CURLE_OK) && (passwdp != (char **)0x0)) &&
     ((local_a0 != (char *)0x0 &&
      (obuf = (char *)(*Curl_cmalloc)((size_t)(local_a0 + 1)), obuf == (char *)0x0)))) {
    (*Curl_cfree)(pbuf);
    ubuf._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  if (((ubuf._4_4_ == CURLE_OK) && (optionsp != (char **)0x0)) &&
     ((local_b0 != (char *)0x0 &&
      (psep = (char *)(*Curl_cmalloc)((size_t)(local_b0 + 1)), psep == (char *)0x0)))) {
    (*Curl_cfree)(obuf);
    (*Curl_cfree)(pbuf);
    ubuf._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  if (ubuf._4_4_ == CURLE_OK) {
    if (pbuf != (char *)0x0) {
      memcpy(pbuf,login,local_88);
      pbuf[local_88] = '\0';
      (*Curl_cfree)(*userp);
      *userp = (char *)0x0;
      *userp = pbuf;
    }
    if (obuf != (char *)0x0) {
      memcpy(obuf,osep + 1,(size_t)local_a0);
      obuf[(long)local_a0] = '\0';
      (*Curl_cfree)(*passwdp);
      *passwdp = (char *)0x0;
      *passwdp = obuf;
    }
    if (psep != (char *)0x0) {
      memcpy(psep,(void *)(ulen + 1),(size_t)local_b0);
      psep[(long)local_b0] = '\0';
      (*Curl_cfree)(*optionsp);
      *optionsp = (char *)0x0;
      *optionsp = psep;
    }
  }
  return ubuf._4_4_;
}

Assistant:

static CURLcode parse_login_details(const char *login, const size_t len,
                                    char **userp, char **passwdp,
                                    char **optionsp)
{
  CURLcode result = CURLE_OK;
  char *ubuf = NULL;
  char *pbuf = NULL;
  char *obuf = NULL;
  const char *psep = NULL;
  const char *osep = NULL;
  size_t ulen;
  size_t plen;
  size_t olen;

  /* Attempt to find the password separator */
  if(passwdp) {
    psep = strchr(login, ':');

    /* Within the constraint of the login string */
    if(psep >= login + len)
      psep = NULL;
  }

  /* Attempt to find the options separator */
  if(optionsp) {
    osep = strchr(login, ';');

    /* Within the constraint of the login string */
    if(osep >= login + len)
      osep = NULL;
  }

  /* Calculate the portion lengths */
  ulen = (psep ?
          (size_t)(osep && psep > osep ? osep - login : psep - login) :
          (osep ? (size_t)(osep - login) : len));
  plen = (psep ?
          (osep && osep > psep ? (size_t)(osep - psep) :
                                 (size_t)(login + len - psep)) - 1 : 0);
  olen = (osep ?
          (psep && psep > osep ? (size_t)(psep - osep) :
                                 (size_t)(login + len - osep)) - 1 : 0);

  /* Allocate the user portion buffer */
  if(userp && ulen) {
    ubuf = malloc(ulen + 1);
    if(!ubuf)
      result = CURLE_OUT_OF_MEMORY;
  }

  /* Allocate the password portion buffer */
  if(!result && passwdp && plen) {
    pbuf = malloc(plen + 1);
    if(!pbuf) {
      free(ubuf);
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  /* Allocate the options portion buffer */
  if(!result && optionsp && olen) {
    obuf = malloc(olen + 1);
    if(!obuf) {
      free(pbuf);
      free(ubuf);
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  if(!result) {
    /* Store the user portion if necessary */
    if(ubuf) {
      memcpy(ubuf, login, ulen);
      ubuf[ulen] = '\0';
      Curl_safefree(*userp);
      *userp = ubuf;
    }

    /* Store the password portion if necessary */
    if(pbuf) {
      memcpy(pbuf, psep + 1, plen);
      pbuf[plen] = '\0';
      Curl_safefree(*passwdp);
      *passwdp = pbuf;
    }

    /* Store the options portion if necessary */
    if(obuf) {
      memcpy(obuf, osep + 1, olen);
      obuf[olen] = '\0';
      Curl_safefree(*optionsp);
      *optionsp = obuf;
    }
  }

  return result;
}